

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerResults.cpp
# Opt level: O2

void __thiscall
I2cAnalyzerResults::GenerateExportFile
          (I2cAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  undefined8 uVar1;
  undefined4 uVar2;
  char cVar3;
  uint uVar4;
  void *pvVar5;
  ulonglong uVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  char ack [32];
  Frame frame;
  byte local_3f0;
  undefined7 uStack_3ef;
  char local_3e0;
  byte local_3df;
  string local_3d8 [8];
  uint local_3d0;
  char rw [128];
  char address [128];
  char data [128];
  char time [128];
  stringstream ss;
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pvVar5 = (void *)AnalyzerHelpers::StartFile(file,false);
  uVar6 = Analyzer::GetTriggerSample();
  uVar4 = Analyzer::GetSampleRate();
  poVar7 = std::operator<<(local_1a8,"Time [s],Packet ID,Address,Data,Read/Write,ACK/NAK");
  std::endl<char,std::char_traits<char>>(poVar7);
  address[0x70] = '\0';
  address[0x71] = '\0';
  address[0x72] = '\0';
  address[0x73] = '\0';
  address[0x74] = '\0';
  address[0x75] = '\0';
  address[0x76] = '\0';
  address[0x77] = '\0';
  address[0x78] = '\0';
  address[0x79] = '\0';
  address[0x7a] = '\0';
  address[0x7b] = '\0';
  address[0x7c] = '\0';
  address[0x7d] = '\0';
  address[0x7e] = '\0';
  address[0x7f] = '\0';
  address[0x60] = '\0';
  address[0x61] = '\0';
  address[0x62] = '\0';
  address[99] = '\0';
  address[100] = '\0';
  address[0x65] = '\0';
  address[0x66] = '\0';
  address[0x67] = '\0';
  address[0x68] = '\0';
  address[0x69] = '\0';
  address[0x6a] = '\0';
  address[0x6b] = '\0';
  address[0x6c] = '\0';
  address[0x6d] = '\0';
  address[0x6e] = '\0';
  address[0x6f] = '\0';
  address[0x50] = '\0';
  address[0x51] = '\0';
  address[0x52] = '\0';
  address[0x53] = '\0';
  address[0x54] = '\0';
  address[0x55] = '\0';
  address[0x56] = '\0';
  address[0x57] = '\0';
  address[0x58] = '\0';
  address[0x59] = '\0';
  address[0x5a] = '\0';
  address[0x5b] = '\0';
  address[0x5c] = '\0';
  address[0x5d] = '\0';
  address[0x5e] = '\0';
  address[0x5f] = '\0';
  address[0x40] = '\0';
  address[0x41] = '\0';
  address[0x42] = '\0';
  address[0x43] = '\0';
  address[0x44] = '\0';
  address[0x45] = '\0';
  address[0x46] = '\0';
  address[0x47] = '\0';
  address[0x48] = '\0';
  address[0x49] = '\0';
  address[0x4a] = '\0';
  address[0x4b] = '\0';
  address[0x4c] = '\0';
  address[0x4d] = '\0';
  address[0x4e] = '\0';
  address[0x4f] = '\0';
  address[0x30] = '\0';
  address[0x31] = '\0';
  address[0x32] = '\0';
  address[0x33] = '\0';
  address[0x34] = '\0';
  address[0x35] = '\0';
  address[0x36] = '\0';
  address[0x37] = '\0';
  address[0x38] = '\0';
  address[0x39] = '\0';
  address[0x3a] = '\0';
  address[0x3b] = '\0';
  address[0x3c] = '\0';
  address[0x3d] = '\0';
  address[0x3e] = '\0';
  address[0x3f] = '\0';
  address[0x20] = '\0';
  address[0x21] = '\0';
  address[0x22] = '\0';
  address[0x23] = '\0';
  address[0x24] = '\0';
  address[0x25] = '\0';
  address[0x26] = '\0';
  address[0x27] = '\0';
  address[0x28] = '\0';
  address[0x29] = '\0';
  address[0x2a] = '\0';
  address[0x2b] = '\0';
  address[0x2c] = '\0';
  address[0x2d] = '\0';
  address[0x2e] = '\0';
  address[0x2f] = '\0';
  address[0x10] = '\0';
  address[0x11] = '\0';
  address[0x12] = '\0';
  address[0x13] = '\0';
  address[0x14] = '\0';
  address[0x15] = '\0';
  address[0x16] = '\0';
  address[0x17] = '\0';
  address[0x18] = '\0';
  address[0x19] = '\0';
  address[0x1a] = '\0';
  address[0x1b] = '\0';
  address[0x1c] = '\0';
  address[0x1d] = '\0';
  address[0x1e] = '\0';
  address[0x1f] = '\0';
  address[0] = '\0';
  address[1] = '\0';
  address[2] = '\0';
  address[3] = '\0';
  address[4] = '\0';
  address[5] = '\0';
  address[6] = '\0';
  address[7] = '\0';
  address[8] = '\0';
  address[9] = '\0';
  address[10] = '\0';
  address[0xb] = '\0';
  address[0xc] = '\0';
  address[0xd] = '\0';
  address[0xe] = '\0';
  address[0xf] = '\0';
  rw[0x70] = '\0';
  rw[0x71] = '\0';
  rw[0x72] = '\0';
  rw[0x73] = '\0';
  rw[0x74] = '\0';
  rw[0x75] = '\0';
  rw[0x76] = '\0';
  rw[0x77] = '\0';
  rw[0x78] = '\0';
  rw[0x79] = '\0';
  rw[0x7a] = '\0';
  rw[0x7b] = '\0';
  rw[0x7c] = '\0';
  rw[0x7d] = '\0';
  rw[0x7e] = '\0';
  rw[0x7f] = '\0';
  rw[0x60] = '\0';
  rw[0x61] = '\0';
  rw[0x62] = '\0';
  rw[99] = '\0';
  rw[100] = '\0';
  rw[0x65] = '\0';
  rw[0x66] = '\0';
  rw[0x67] = '\0';
  rw[0x68] = '\0';
  rw[0x69] = '\0';
  rw[0x6a] = '\0';
  rw[0x6b] = '\0';
  rw[0x6c] = '\0';
  rw[0x6d] = '\0';
  rw[0x6e] = '\0';
  rw[0x6f] = '\0';
  rw[0x50] = '\0';
  rw[0x51] = '\0';
  rw[0x52] = '\0';
  rw[0x53] = '\0';
  rw[0x54] = '\0';
  rw[0x55] = '\0';
  rw[0x56] = '\0';
  rw[0x57] = '\0';
  rw[0x58] = '\0';
  rw[0x59] = '\0';
  rw[0x5a] = '\0';
  rw[0x5b] = '\0';
  rw[0x5c] = '\0';
  rw[0x5d] = '\0';
  rw[0x5e] = '\0';
  rw[0x5f] = '\0';
  rw[0x40] = '\0';
  rw[0x41] = '\0';
  rw[0x42] = '\0';
  rw[0x43] = '\0';
  rw[0x44] = '\0';
  rw[0x45] = '\0';
  rw[0x46] = '\0';
  rw[0x47] = '\0';
  rw[0x48] = '\0';
  rw[0x49] = '\0';
  rw[0x4a] = '\0';
  rw[0x4b] = '\0';
  rw[0x4c] = '\0';
  rw[0x4d] = '\0';
  rw[0x4e] = '\0';
  rw[0x4f] = '\0';
  rw[0x30] = '\0';
  rw[0x31] = '\0';
  rw[0x32] = '\0';
  rw[0x33] = '\0';
  rw[0x34] = '\0';
  rw[0x35] = '\0';
  rw[0x36] = '\0';
  rw[0x37] = '\0';
  rw[0x38] = '\0';
  rw[0x39] = '\0';
  rw[0x3a] = '\0';
  rw[0x3b] = '\0';
  rw[0x3c] = '\0';
  rw[0x3d] = '\0';
  rw[0x3e] = '\0';
  rw[0x3f] = '\0';
  rw[0x20] = '\0';
  rw[0x21] = '\0';
  rw[0x22] = '\0';
  rw[0x23] = '\0';
  rw[0x24] = '\0';
  rw[0x25] = '\0';
  rw[0x26] = '\0';
  rw[0x27] = '\0';
  rw[0x28] = '\0';
  rw[0x29] = '\0';
  rw[0x2a] = '\0';
  rw[0x2b] = '\0';
  rw[0x2c] = '\0';
  rw[0x2d] = '\0';
  rw[0x2e] = '\0';
  rw[0x2f] = '\0';
  rw[0x10] = '\0';
  rw[0x11] = '\0';
  rw[0x12] = '\0';
  rw[0x13] = '\0';
  rw[0x14] = '\0';
  rw[0x15] = '\0';
  rw[0x16] = '\0';
  rw[0x17] = '\0';
  rw[0x18] = '\0';
  rw[0x19] = '\0';
  rw[0x1a] = '\0';
  rw[0x1b] = '\0';
  rw[0x1c] = '\0';
  rw[0x1d] = '\0';
  rw[0x1e] = '\0';
  rw[0x1f] = '\0';
  rw[0] = '\0';
  rw[1] = '\0';
  rw[2] = '\0';
  rw[3] = '\0';
  rw[4] = '\0';
  rw[5] = '\0';
  rw[6] = '\0';
  rw[7] = '\0';
  rw[8] = '\0';
  rw[9] = '\0';
  rw[10] = '\0';
  rw[0xb] = '\0';
  rw[0xc] = '\0';
  rw[0xd] = '\0';
  rw[0xe] = '\0';
  rw[0xf] = '\0';
  uVar8 = AnalyzerResults::GetNumFrames();
  uVar11 = 0;
  do {
    if (uVar8 <= uVar11) {
      AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar8);
      AnalyzerHelpers::EndFile(pvVar5);
LAB_001070d1:
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return;
    }
    AnalyzerResults::GetFrame((ulonglong)&frame);
    if (local_3e0 == '\0') {
      AnalyzerHelpers::GetNumberString
                (CONCAT71(uStack_3ef,local_3f0) >> 1,display_base,7,address,0x80);
      if ((local_3f0 & 1) == 0) {
        builtin_strncpy(rw,"Write",6);
        uVar2 = rw._0_4_;
        rw._0_8_ = CONCAT44(rw._4_4_,uVar2);
      }
      else {
        rw._4_4_ = SUB84(rw._0_8_,4) & 0xffffff00;
        builtin_strncpy(rw,"Read",4);
      }
      if ((local_3df & 1) == 0) {
        if ((local_3df & 2) == 0) {
          builtin_strncpy(data,"NAK",4);
        }
        else {
          builtin_strncpy(data,"Missing ACK/NAK",0x10);
        }
        AnalyzerHelpers::GetTimeString(_frame,uVar6,uVar4,time,0x80);
        poVar7 = std::operator<<(local_1a8,time);
        poVar7 = std::operator<<(poVar7,",,");
        poVar7 = std::operator<<(poVar7,address);
        poVar7 = std::operator<<(poVar7,",");
        poVar7 = std::operator<<(poVar7,"");
        poVar7 = std::operator<<(poVar7,",");
        poVar7 = std::operator<<(poVar7,rw);
        poVar7 = std::operator<<(poVar7,",");
        poVar7 = std::operator<<(poVar7,data);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        uVar1 = ack._0_8_;
        std::__cxx11::stringbuf::str();
        AnalyzerHelpers::AppendToFile((uchar *)uVar1,local_3d0,pvVar5);
        std::__cxx11::string::~string(local_3d8);
        std::__cxx11::string::~string((string *)ack);
        ack._0_8_ = ack + 0x10;
        ack[8] = '\0';
        ack[9] = '\0';
        ack[10] = '\0';
        ack[0xb] = '\0';
        ack[0xc] = '\0';
        ack[0xd] = '\0';
        ack[0xe] = '\0';
        ack[0xf] = '\0';
        ack[0x10] = '\0';
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string((string *)ack);
      }
    }
    else {
      AnalyzerHelpers::GetTimeString(_frame,uVar6,uVar4,time,0x80);
      AnalyzerHelpers::GetNumberString(CONCAT71(uStack_3ef,local_3f0),display_base,8,data,0x80);
      if ((local_3df & 1) == 0) {
        if ((local_3df & 2) == 0) {
          builtin_strncpy(ack,"NAK",4);
        }
        else {
          builtin_strncpy(ack,"Missing ACK/NAK",0x10);
        }
      }
      else {
        builtin_strncpy(ack,"ACK",4);
      }
      lVar9 = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
      if (lVar9 == -1) {
        poVar7 = std::operator<<(local_1a8,time);
        pcVar10 = ",,";
      }
      else {
        poVar7 = std::operator<<(local_1a8,time);
        poVar7 = std::operator<<(poVar7,",");
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
        pcVar10 = ",";
      }
      poVar7 = std::operator<<(poVar7,pcVar10);
      poVar7 = std::operator<<(poVar7,address);
      poVar7 = std::operator<<(poVar7,",");
      poVar7 = std::operator<<(poVar7,data);
      poVar7 = std::operator<<(poVar7,",");
      poVar7 = std::operator<<(poVar7,rw);
      poVar7 = std::operator<<(poVar7,",");
      poVar7 = std::operator<<(poVar7,ack);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::__cxx11::stringbuf::str();
    uVar1 = time._0_8_;
    std::__cxx11::stringbuf::str();
    AnalyzerHelpers::AppendToFile((uchar *)uVar1,data._8_4_,pvVar5);
    std::__cxx11::string::~string((string *)data);
    std::__cxx11::string::~string((string *)time);
    time._0_8_ = time + 0x10;
    time[8] = '\0';
    time[9] = '\0';
    time[10] = '\0';
    time[0xb] = '\0';
    time[0xc] = '\0';
    time[0xd] = '\0';
    time[0xe] = '\0';
    time[0xf] = '\0';
    time[0x10] = '\0';
    std::__cxx11::stringbuf::str(local_1a0);
    std::__cxx11::string::~string((string *)time);
    cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)uVar11);
    if (cVar3 != '\0') {
      AnalyzerHelpers::EndFile(pvVar5);
      Frame::~Frame(&frame);
      goto LAB_001070d1;
    }
    Frame::~Frame(&frame);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void I2cAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    // export_type_user_id is only important if we have more than one export type.

    std::stringstream ss;
    void* f = AnalyzerHelpers::StartFile( file );
    ;

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    ss << "Time [s],Packet ID,Address,Data,Read/Write,ACK/NAK" << std::endl;

    char address[ 128 ] = "";
    char rw[ 128 ] = "";
    U64 num_frames = GetNumFrames();
    for( U32 i = 0; i < num_frames; i++ )
    {
        Frame frame = GetFrame( i );

        if( frame.mType == I2cAddress )
        {
            AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, address, 128 );
            if( ( frame.mData1 & 0x1 ) != 0 )
                snprintf( rw, sizeof( rw ), "Read" );
            else
                snprintf( rw, sizeof( rw ), "Write" );

            // check to see if the address packet is NAKed. If it is, we need to export the line here.
            if( ( frame.mFlags & I2C_FLAG_ACK ) == 0 )
            {
                char ack[ 32 ];
                if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
                    snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
                else
                    snprintf( ack, sizeof( ack ), "NAK" );
                // we need to write out the line here.
                char time[ 128 ];
                AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time, 128 );

                ss << time << ",," << address << ","
                   << ""
                   << "," << rw << "," << ack << std::endl;
                AnalyzerHelpers::AppendToFile( ( U8* )ss.str().c_str(), ss.str().length(), f );
                ss.str( std::string() );
            }
        }
        else
        {
            char time[ 128 ];
            AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time, 128 );

            char data[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, data, 128 );

            char ack[ 32 ];
            if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
                snprintf( ack, sizeof( ack ), "ACK" );
            else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
                snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
            else
                snprintf( ack, sizeof( ack ), "NAK" );


            U64 packet_id = GetPacketContainingFrameSequential( i );
            if( packet_id != INVALID_RESULT_INDEX )
                ss << time << "," << packet_id << "," << address << "," << data << "," << rw << "," << ack << std::endl;
            else
                ss << time << ",," << address << "," << data << "," << rw << "," << ack << std::endl;
        }

        AnalyzerHelpers::AppendToFile( ( U8* )ss.str().c_str(), ss.str().length(), f );
        ss.str( std::string() );


        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            AnalyzerHelpers::EndFile( f );
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
    AnalyzerHelpers::EndFile( f );
}